

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

void __thiscall script_tests::compute_tapleaf::test_method(compute_tapleaf *this)

{
  Span<const_unsigned_char> script_00;
  Span<const_unsigned_char> script_01;
  bool bVar1;
  long in_FS_OFFSET;
  uint8_t script [6];
  uint256 tlc2;
  uint256 tlc0;
  char *in_stack_fffffffffffffe18;
  lazy_ostream *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  const_string *in_stack_fffffffffffffe40;
  const_string *msg;
  size_t in_stack_fffffffffffffe48;
  undefined1 *line_num;
  uint8_t leaf_version;
  const_string *in_stack_fffffffffffffe50;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffe58;
  char *this_00;
  undefined1 local_140 [16];
  undefined1 local_130 [32];
  const_string local_110;
  undefined1 local_100 [32];
  undefined1 local_e0 [16];
  undefined1 local_d0 [66];
  undefined4 local_8e;
  undefined2 local_8a;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  lazy_ostream local_48;
  undefined8 local_38;
  undefined8 local_30;
  lazy_ostream local_28;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_8e = 0x626f6f66;
  local_8a = 0x7261;
  local_28._vptr_lazy_ostream = (_func_int **)0x3f136767b5b9c06;
  local_28.m_empty = true;
  local_28._9_7_ = 0x5ad6ed97cd4552;
  local_18 = 0xcdcc11d605b9027b;
  local_10 = 0xedbc10c272a1215d;
  local_48._vptr_lazy_ostream = (_func_int **)0x1b25eca76451b27a;
  local_48.m_empty = true;
  local_48._9_7_ = 0x6359c391b59263;
  local_38 = 0x259dbef5d8a59df0;
  local_30 = 0x8b5c4f90ae6bf76e;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28,
               (pointer)in_stack_fffffffffffffe20,(unsigned_long)in_stack_fffffffffffffe18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe20,(char (*) [1])in_stack_fffffffffffffe18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28,
               (pointer)in_stack_fffffffffffffe20,(unsigned_long)in_stack_fffffffffffffe18);
    Span<const_unsigned_char>::Span<6>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffe18,(uchar (*) [6])0xa724e1);
    script_00.m_size = (size_t)in_stack_fffffffffffffe58;
    script_00.m_data = (uchar *)in_stack_fffffffffffffe50;
    ComputeTapleafHash((uint8_t)(in_stack_fffffffffffffe48 >> 0x38),script_00);
    in_stack_fffffffffffffe28 = "tlc0";
    in_stack_fffffffffffffe20 = &local_28;
    in_stack_fffffffffffffe18 = "ComputeTapleafHash(0xc0, Span(script))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_d0,local_e0,0x6bc,1,2,local_68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
    ;
    line_num = local_100;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28,
               (pointer)in_stack_fffffffffffffe20,(unsigned_long)in_stack_fffffffffffffe18);
    file = &local_110;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,file,(size_t)line_num,msg);
    leaf_version = (uint8_t)((ulong)line_num >> 0x38);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe20,(char (*) [1])in_stack_fffffffffffffe18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28,
               (pointer)in_stack_fffffffffffffe20,(unsigned_long)in_stack_fffffffffffffe18);
    Span<const_unsigned_char>::Span<6>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffe18,(uchar (*) [6])0xa7261d);
    script_01.m_size = (size_t)this_00;
    script_01.m_data = (uchar *)file;
    ComputeTapleafHash(leaf_version,script_01);
    in_stack_fffffffffffffe28 = "tlc2";
    in_stack_fffffffffffffe20 = &local_48;
    in_stack_fffffffffffffe18 = "ComputeTapleafHash(0xc2, Span(script))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_130,local_140,0x6bd,1,2,local_88);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(compute_tapleaf)
{
    constexpr uint8_t script[6] = {'f','o','o','b','a','r'};
    constexpr uint256 tlc0{"edbc10c272a1215dcdcc11d605b9027b5ad6ed97cd45521203f136767b5b9c06"};
    constexpr uint256 tlc2{"8b5c4f90ae6bf76e259dbef5d8a59df06359c391b59263741b25eca76451b27a"};

    BOOST_CHECK_EQUAL(ComputeTapleafHash(0xc0, Span(script)), tlc0);
    BOOST_CHECK_EQUAL(ComputeTapleafHash(0xc2, Span(script)), tlc2);
}